

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QExplicitlySharedDataPointer<QSslConfigurationPrivate>::detach_helper
          (QExplicitlySharedDataPointer<QSslConfigurationPrivate> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  QSslConfigurationPrivate *this_00;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  QExplicitlySharedDataPointer<QSslConfigurationPrivate> *in_RDI;
  void *in_R8;
  QSslConfigurationPrivate *x;
  
  iVar2 = clone(in_RDI,in_RSI,in_RDX,in_ECX,in_R8);
  QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x3adaab);
  Qt::totally_ordered_wrapper<QSslConfigurationPrivate_*>::operator->
            ((totally_ordered_wrapper<QSslConfigurationPrivate_*> *)0x3adab5);
  bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x3adabd);
  if ((!bVar1) &&
     (this_00 = Qt::totally_ordered_wrapper<QSslConfigurationPrivate_*>::get(&in_RDI->d),
     this_00 != (QSslConfigurationPrivate *)0x0)) {
    QSslConfigurationPrivate::~QSslConfigurationPrivate(this_00);
    operator_delete(this_00,0x140);
  }
  Qt::totally_ordered_wrapper<QSslConfigurationPrivate_*>::reset
            (&in_RDI->d,(QSslConfigurationPrivate *)CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QExplicitlySharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d->ref.deref())
        delete d.get();
    d.reset(x);
}